

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O3

int __thiscall deqp::gles2::Functional::ShaderApiTests::init(ShaderApiTests *this,EVP_PKEY_CTX *ctx)

{
  size_type *psVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  TestNode *pTVar4;
  ApiCase *pAVar5;
  long *plVar6;
  undefined8 *puVar7;
  ShaderSourceSplitCase *this_00;
  TestNode *node;
  char *pcVar8;
  ProgramStateCase *pPVar9;
  ulong *extraout_RAX;
  ulong *puVar10;
  int iVar11;
  long *plVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  bool bVar16;
  int numSlices;
  ShaderType shaderType;
  ShaderType SVar17;
  bool bVar18;
  string caseDesc_1;
  string caseDesc;
  string caseName;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  TestNode *local_200;
  TestNode *local_1f8;
  int local_1f0;
  deUint32 local_1ec;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  ulong local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"create_delete","glCreateShader() tests");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"create_vertex_shader",
                   "Create vertex shader object");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0211e728;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"create_fragment_shader",
                   "Create fragment shader object");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0211e728;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa8);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"delete_vertex_fragment",
                   "Delete vertex shader and fragment shader");
  pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0211e780;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"compile_link","Compile and link tests");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"compile_vertex_shader",
                   "Compile vertex shader");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0211e7f8;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"compile_fragment_shader",
                   "Compile fragment shader");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0211e7f8;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa8);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"link_vertex_fragment",
                   "Link vertex and fragment shaders");
  pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0211e850;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"shader_source","glShaderSource() tests");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_200 = pTVar4;
  local_1f8 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  bVar15 = 0;
  bVar18 = true;
  do {
    bVar16 = bVar18;
    local_2c0 = &local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"replace_source","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2c0);
    local_1a8 = &local_198;
    plVar12 = plVar6 + 2;
    if ((long *)*plVar6 == plVar12) {
      local_198 = *plVar12;
      lStack_190 = plVar6[3];
    }
    else {
      local_198 = *plVar12;
      local_1a8 = (long *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)plVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    local_2a0 = &local_290;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"Replace source code of ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
    local_2e0 = &local_2d0;
    plVar12 = plVar6 + 2;
    if ((long *)*plVar6 == plVar12) {
      local_2d0 = *plVar12;
      lStack_2c8 = plVar6[3];
    }
    else {
      local_2d0 = *plVar12;
      local_2e0 = (long *)*plVar6;
    }
    local_2d8 = plVar6[1];
    *plVar6 = (long)plVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_2c0 = &local_2b0;
    plVar12 = plVar6 + 2;
    if ((long *)*plVar6 == plVar12) {
      local_2b0 = *plVar12;
      lStack_2a8 = plVar6[3];
    }
    else {
      local_2b0 = *plVar12;
      local_2c0 = (long *)*plVar6;
    }
    local_2b8 = plVar6[1];
    *plVar6 = (long)plVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,local_290 + 1);
    }
    pAVar5 = (ApiCase *)operator_new(0xa0);
    ApiCase::ApiCase(pAVar5,(Context *)local_1f8[1]._vptr_TestNode,(char *)local_1a8,
                     (char *)local_2c0);
    (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0211e8b0;
    *(uint *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (uint)bVar15;
    tcu::TestNode::addChild(local_200,(TestNode *)pAVar5);
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    bVar15 = 1;
    uVar14 = 0;
    bVar18 = false;
  } while (bVar16);
  do {
    iVar11 = (int)uVar14;
    bVar18 = iVar11 != 0;
    local_1b0 = "_null_terminated";
    if (bVar18) {
      local_1b0 = "_specify_lengths";
    }
    local_1c0 = "";
    local_1b8 = "";
    if (bVar18) {
      local_1b8 = ", using explicitly specified string lengths";
    }
    local_1ec = (uint)bVar18 + (uint)(iVar11 == 2) * 2;
    if (iVar11 == 2) {
      local_1b0 = "_random_negative_length";
      local_1c0 = " with random negative length values";
    }
    iVar11 = 1;
    local_1c8 = uVar14;
    do {
      numSlices = 1 << ((byte)iVar11 & 0x1f);
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      local_1f0 = iVar11;
      do {
        bVar16 = bVar18;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,numSlices);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,0x1bb6ae4);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        iVar11 = 0x1cc252f;
        if (SVar17 != SHADERTYPE_VERTEX) {
          iVar11 = 0x1b74946;
        }
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,iVar11,iVar11 + 6 + SVar17 * 2);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_260 = &local_250;
        puVar10 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar10) {
          local_250 = *puVar10;
          lStack_248 = plVar6[3];
        }
        else {
          local_250 = *puVar10;
          local_260 = (ulong *)*plVar6;
        }
        local_258 = plVar6[1];
        *plVar6 = (long)puVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,numSlices);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar14 = 0xf;
        if (local_260 != &local_250) {
          uVar14 = local_250;
        }
        if (uVar14 < (ulong)(local_1e0 + local_258)) {
          uVar14 = 0xf;
          if (local_1e8 != local_1d8) {
            uVar14 = local_1d8[0];
          }
          if (uVar14 < (ulong)(local_1e0 + local_258)) goto LAB_00ed1cb8;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_260);
        }
        else {
LAB_00ed1cb8:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_1e8);
        }
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        psVar1 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_220.field_2._M_allocated_capacity = *psVar1;
          local_220.field_2._8_8_ = puVar7[3];
        }
        else {
          local_220.field_2._M_allocated_capacity = *psVar1;
          local_220._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_220._M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        this_00 = (ShaderSourceSplitCase *)operator_new(0xb8);
        ShaderSourceSplitCase::ShaderSourceSplitCase
                  (this_00,(Context *)local_1f8[1]._vptr_TestNode,(char *)local_2c0,
                   (char *)local_2e0,SVar17,numSlices,local_1ec);
        tcu::TestNode::addChild(local_200,(TestNode *)this_00);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      iVar11 = local_1f0 + 1;
    } while (iVar11 != 4);
    uVar13 = (int)local_1c8 + 1;
    uVar14 = (ulong)uVar13;
    if (uVar13 == 3) {
      node = (TestNode *)operator_new(0x78);
      pTVar4 = local_1f8;
      pp_Var3 = local_1f8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,(TestContext *)*pp_Var3,"program_state",
                 "Program state persistence tests");
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
      node[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar4,node);
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"detach_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_200 = node;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"detach shader","");
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      do {
        bVar16 = bVar18;
        pcVar8 = glu::getShaderTypeName(SVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,pcVar8,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1a8);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar9 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase(pPVar9,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar17)
        ;
        (pPVar9->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_0211e960;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar9);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar4 = local_1f8;
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"reattach_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"reattach shader","");
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      do {
        bVar16 = bVar18;
        pcVar8 = glu::getShaderTypeName(SVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,pcVar8,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1a8);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar9 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase(pPVar9,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar17)
        ;
        (pPVar9->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_0211e9c0;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar9);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar4 = local_1f8;
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"delete_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"delete shader","");
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      do {
        bVar16 = bVar18;
        pcVar8 = glu::getShaderTypeName(SVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,pcVar8,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1a8);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar9 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase(pPVar9,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar17)
        ;
        (pPVar9->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_0211ea20;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar9);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar4 = local_1f8;
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"replace_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"replace shader object","");
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      do {
        bVar16 = bVar18;
        pcVar8 = glu::getShaderTypeName(SVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,pcVar8,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1a8);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar9 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase(pPVar9,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar17)
        ;
        (pPVar9->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_0211ea80;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar9);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar4 = local_1f8;
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"recompile_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"recompile shader","");
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      do {
        bVar16 = bVar18;
        pcVar8 = glu::getShaderTypeName(SVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,pcVar8,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1a8);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar9 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase(pPVar9,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar17)
        ;
        (pPVar9->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_0211eae0;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar9);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        pTVar4 = local_1f8;
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"replace_source","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"replace shader source","");
      SVar17 = SHADERTYPE_VERTEX;
      bVar18 = true;
      do {
        bVar16 = bVar18;
        pcVar8 = glu::getShaderTypeName(SVar17);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,pcVar8,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8);
        local_2c0 = &local_2b0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2b0 = *plVar12;
          lStack_2a8 = plVar6[3];
        }
        else {
          local_2b0 = *plVar12;
          local_2c0 = (long *)*plVar6;
        }
        local_2b8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_270 = *plVar12;
          lStack_268 = plVar6[3];
        }
        else {
          local_270 = *plVar12;
          local_280 = (long *)*plVar6;
        }
        local_278 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1a8);
        local_2a0 = &local_290;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_290 = *plVar12;
          lStack_288 = plVar6[3];
        }
        else {
          local_290 = *plVar12;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2d0 = *plVar12;
          lStack_2c8 = plVar6[3];
        }
        else {
          local_2d0 = *plVar12;
          local_2e0 = (long *)*plVar6;
        }
        local_2d8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar9 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase(pPVar9,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar17)
        ;
        (pPVar9->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_0211eb40;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar9);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        SVar17 = SHADERTYPE_FRAGMENT;
        bVar18 = false;
      } while (bVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      puVar10 = &local_250;
      if (local_260 != puVar10) {
        operator_delete(local_260,local_250 + 1);
        puVar10 = extraout_RAX;
      }
      return (int)puVar10;
    }
  } while( true );
}

Assistant:

void ShaderApiTests::init (void)
{
	// create and delete shaders
	{
		TestCaseGroup* createDeleteGroup = new TestCaseGroup(m_context, "create_delete", "glCreateShader() tests");
		addChild(createDeleteGroup);

		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_vertex_shader",		"Create vertex shader object",		glu::SHADERTYPE_VERTEX));
		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_fragment_shader",	"Create fragment shader object",	glu::SHADERTYPE_FRAGMENT));

		createDeleteGroup->addChild(new DeleteShaderCase(m_context,	"delete_vertex_fragment",	"Delete vertex shader and fragment shader"));
	}

	// compile and link
	{
		TestCaseGroup* compileLinkGroup = new TestCaseGroup(m_context, "compile_link", "Compile and link tests");
		addChild(compileLinkGroup);

		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_vertex_shader",	"Compile vertex shader",	glu::SHADERTYPE_VERTEX));
		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_fragment_shader",	"Compile fragment shader",	glu::SHADERTYPE_FRAGMENT));

		compileLinkGroup->addChild(new LinkVertexFragmentCase(m_context,	"link_vertex_fragment",	"Link vertex and fragment shaders"));
	}

	// shader source
	{
		TestCaseGroup* shaderSourceGroup = new TestCaseGroup(m_context, "shader_source", "glShaderSource() tests");
		addChild(shaderSourceGroup);

		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType	= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const std::string		caseName	= std::string("replace_source") + ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");
			const std::string		caseDesc	= std::string("Replace source code of ") + ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "fragment" : "vertex") + " shader.";

			shaderSourceGroup->addChild(new ShaderSourceReplaceCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType));
		}

		for (int stringLengthsInt	= 0; stringLengthsInt < 3; stringLengthsInt++)
		for (int caseNdx = 1; caseNdx <= 3; caseNdx++)
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const int				numSlices		= 1 << caseNdx;
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const bool				explicitLengths	= (stringLengthsInt != 0);
			const bool				randomNullTerm	= (stringLengthsInt == 2);

			const deUint32			flags			= (explicitLengths	? CASE_EXPLICIT_SOURCE_LENGTHS	: 0)
													| (randomNullTerm	? CASE_RANDOM_NULL_TERMINATED	: 0);

			const std::string		caseName		= "split_source_"
													+ de::toString(numSlices)
													+ (randomNullTerm ? "_random_negative_length" : (explicitLengths ? "_specify_lengths" : "_null_terminated"))
													+ ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");

			const std::string		caseDesc		= std::string((shaderType == glu::SHADERTYPE_FRAGMENT) ? "Fragment" : "Vertex")
													+ " shader source split into "
													+ de::toString(numSlices)
													+ " pieces"
													+ (explicitLengths ? ", using explicitly specified string lengths" : "")
													+ (randomNullTerm ? " with random negative length values" : "");

			shaderSourceGroup->addChild(new ShaderSourceSplitCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType, numSlices, flags));
		}
	}

	// link status and infolog
	{
		TestCaseGroup* linkStatusGroup = new TestCaseGroup(m_context, "program_state", "Program state persistence tests");
		addChild(linkStatusGroup);

		addProgramStateCase<ProgramStateDetachShaderCase>		(linkStatusGroup,	m_context,	"detach_shader",	"detach shader");
		addProgramStateCase<ProgramStateReattachShaderCase>		(linkStatusGroup,	m_context,	"reattach_shader",	"reattach shader");
		addProgramStateCase<ProgramStateDeleteShaderCase>		(linkStatusGroup,	m_context,	"delete_shader",	"delete shader");
		addProgramStateCase<ProgramStateReplaceShaderCase>		(linkStatusGroup,	m_context,	"replace_shader",	"replace shader object");
		addProgramStateCase<ProgramStateRecompileShaderCase>	(linkStatusGroup,	m_context,	"recompile_shader",	"recompile shader");
		addProgramStateCase<ProgramStateReplaceSourceCase>		(linkStatusGroup,	m_context,	"replace_source",	"replace shader source");
	}
}